

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it,PolicyStackEntry t)

{
  pointer *ppPVar1;
  iterator __position;
  ulong uVar2;
  iterator __position_00;
  iterator iVar3;
  ulong local_10;
  
  local_10 = it.Position;
  __position_00._M_current =
       (this->Data).
       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar2 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar2 != ((long)__position_00._M_current -
                (long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0xb6,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if (local_10 <= uVar2) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_10);
      __position_00._M_current =
           (this->Data).
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = local_10;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if (__position_00._M_current ==
        (this->Data).
        super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmStateDetail::PolicyStackEntry,std::allocator<cmStateDetail::PolicyStackEntry>>::
      _M_realloc_insert<cmStateDetail::PolicyStackEntry_const&>
                ((vector<cmStateDetail::PolicyStackEntry,std::allocator<cmStateDetail::PolicyStackEntry>>
                  *)this,__position_00,&t);
    }
    else {
      (__position_00._M_current)->Weak = t.Weak;
      *(undefined7 *)&(__position_00._M_current)->field_0x21 = t._33_7_;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] =
           t.super_PolicyMap.Status.super__Base_bitset<4UL>._M_w[2];
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] =
           t.super_PolicyMap.Status.super__Base_bitset<4UL>._M_w[3];
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] =
           t.super_PolicyMap.Status.super__Base_bitset<4UL>._M_w[0];
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] =
           t.super_PolicyMap.Status.super__Base_bitset<4UL>._M_w[1];
      ppPVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    iVar3.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar3.Tree = this;
    return iVar3;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0xb7,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Push_impl(iterator it, T t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(t);
    return iterator(this, this->UpPositions.size());
  }